

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage3d(NegativeTestContext *ctx)

{
  int iVar1;
  allocator<char> local_59;
  string local_58;
  deUint32 texture;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"GL_INVALID_ENUM is generated if target is invalid.",
             (allocator<char> *)&texture);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0,0,0,0,0,0,0,0,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,texture);
  iVar1 = etc2EacDataSize(0x12,0x12);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x9278,0x12,0x12,1,0,iVar1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "GL_INVALID_OPERATION is generated if format does not match the internal format of the texture image being modified."
             ,&local_59);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0,0,0,0,0,0,0x9274,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "GL_INVALID_OPERATION is generated if internalformat is an ETC2/EAC format and target is not GL_TEXTURE_2D_ARRAY."
             ,&local_59);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x806f,0,0,0,0,0x12,0x12,1,0x9278,iVar1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "For ETC2/EAC images GL_INVALID_OPERATION is generated if width is not a multiple of four, and width + xoffset is not equal to the width of the texture level."
             ,&local_59);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar1 = etc2EacDataSize(10,4);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,4,0,0,10,4,1,0x9278,iVar1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "For ETC2/EAC images GL_INVALID_OPERATION is generated if height is not a multiple of four, and height + yoffset is not equal to the height of the texture level."
             ,&local_59);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar1 = etc2EacDataSize(4,10);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0,4,0,4,10,1,0x9278,iVar1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "For ETC2/EAC images GL_INVALID_OPERATION is generated if xoffset or yoffset is not a multiple of four."
             ,&local_59);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar1 = etc2EacDataSize(4,4);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,1,0,0,4,4,1,0x9278,iVar1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0,1,0,4,4,1,0x9278,iVar1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,1,1,0,4,4,1,0x9278,iVar1,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void compressedtexsubimage3d (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if target is invalid.");
	ctx.glCompressedTexSubImage3D(0, 0, 0, 0, 0, 0, 0, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	deUint32				texture = 0x1234;
	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D_ARRAY, texture);
	ctx.glCompressedTexImage3D	(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 18, 18, 1, 0, etc2EacDataSize(18, 18), 0);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if format does not match the internal format of the texture image being modified.");
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, 0, 0, 0, GL_COMPRESSED_RGB8_ETC2, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if internalformat is an ETC2/EAC format and target is not GL_TEXTURE_2D_ARRAY.");
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_3D, 0, 0, 0, 0, 18, 18, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(18, 18), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("For ETC2/EAC images GL_INVALID_OPERATION is generated if width is not a multiple of four, and width + xoffset is not equal to the width of the texture level.");
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 4, 0, 0, 10, 4, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(10, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("For ETC2/EAC images GL_INVALID_OPERATION is generated if height is not a multiple of four, and height + yoffset is not equal to the height of the texture level.");
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 4, 0, 4, 10, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 10), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("For ETC2/EAC images GL_INVALID_OPERATION is generated if xoffset or yoffset is not a multiple of four.");
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 1, 0, 0, 4, 4, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 1, 0, 4, 4, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 1, 1, 0, 4, 4, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteTextures		(1, &texture);
}